

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_SimRsbTfo_rec(Gia_Man_t *p,int iObj,int iFanout,Vec_Int_t *vTfo)

{
  int iVar1;
  undefined4 local_24;
  int iFan;
  int i;
  Vec_Int_t *vTfo_local;
  int iFanout_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    for (local_24 = 0; iVar1 = Gia_ObjFanoutNumId(p,iObj), local_24 < iVar1; local_24 = local_24 + 1
        ) {
      iVar1 = Gia_ObjFanoutId(p,iObj,local_24);
      if ((iFanout == -1) || (iVar1 == iFanout)) {
        Gia_SimRsbTfo_rec(p,iVar1,-1,vTfo);
      }
    }
    Vec_IntPush(vTfo,iObj);
  }
  return;
}

Assistant:

void Gia_SimRsbTfo_rec( Gia_Man_t * p, int iObj, int iFanout, Vec_Int_t * vTfo )
{
    int i, iFan;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    Gia_ObjForEachFanoutStaticId( p, iObj, iFan, i )
        if ( iFanout == -1 || iFan == iFanout )
            Gia_SimRsbTfo_rec( p, iFan, -1, vTfo );
    Vec_IntPush( vTfo, iObj );
}